

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int list_insert(List *list,uint index,void *data)

{
  ListNode *pLVar1;
  list_node_ *plVar2;
  List *pLVar3;
  list_node_ *plVar4;
  int iVar5;
  
  pLVar1 = (ListNode *)malloc(0x18);
  pLVar1->data = data;
  if (index < 2) {
    plVar2 = list->head;
    pLVar3 = list;
    if (plVar2 != (list_node_ *)0x0) {
      if (list->tail == (ListNode *)0x0) {
        list->tail = pLVar1;
        pLVar1->prev = plVar2;
        pLVar3 = (List *)&plVar2->next;
      }
      else {
        plVar2->prev = pLVar1;
        pLVar1->next = plVar2;
      }
    }
  }
  else {
    if ((index < list->size) && (plVar2 = list->head, plVar2 != (list_node_ *)0x0)) {
      iVar5 = index + 1;
      do {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          pLVar1->next = plVar2;
          plVar4 = plVar2->prev;
          pLVar3 = (List *)&plVar2->prev;
          goto LAB_00102bae;
        }
        plVar2 = plVar2->next;
      } while (plVar2 != (list_node_ *)0x0);
    }
    if (list->size != index) {
      return -1;
    }
    pLVar3 = (List *)&list->tail;
    plVar4 = list->tail;
LAB_00102bae:
    pLVar1->prev = plVar4;
    plVar4->next = pLVar1;
  }
  pLVar3->head = pLVar1;
  list->size = list->size + 1;
  return 1;
}

Assistant:

int list_insert(List * list, unsigned int index, void *data){
    ListNode* new = new_node(data);
    // 第一个位置插入
    if (index == 0 || index == 1){
        if (list->head == NULL){
            /**
            * 如果头为空,说明没有添加任何数据,所以直接插入
            */
            list->head = new;
        }else if (list->tail == NULL){
            /**
             * 如果尾部也是空,说明这是第二次添加, 所以直接插入到尾
             */
            list->tail = new;
            new->prev = list->head;
            list->head->next = new;
        }else{
            /**
             * 直接在第一个位置插入
             */
            list->head->prev = new;
            new->next = list->head;
            list->head = new;
        }
    }else{
        ListNode* node = list_get_(list, index);
        if (node != NULL){
            /**
             * 直接插入到指定位置
             */
            new->next = node;
            new->prev = node->prev;
            node->prev->next = new;
            node->prev = new;
        }else if(node == NULL && list->size == index){
            /**
             * node等于空且 list->size == index 说明需要更新尾部
             */
            new->prev = list->tail;
            list->tail->next = new;
            list->tail = new;
        }else{
            /**
             * 越界
             */
            return -1;
        }
    }
    /**
     * 维护 size
     */
    list->size++;
    return 1;
}